

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt,char *encoding)

{
  xmlOutputBufferPtr output;
  xmlCharEncodingHandlerPtr pxVar1;
  xmlBufPtr pxVar2;
  char *msg;
  int iVar3;
  
  iVar3 = 0;
  if (((encoding != (char *)0x0) &&
      (output = ctxt->buf, iVar3 = 0, output->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
     (output->conv == (xmlBufPtr)0x0)) {
    pxVar1 = xmlFindCharEncodingHandler(encoding);
    output->encoder = pxVar1;
    if (pxVar1 == (xmlCharEncodingHandlerPtr)0x0) {
      msg = "unknown encoding %s\n";
      iVar3 = 0x57b;
    }
    else {
      pxVar2 = xmlBufCreate();
      output->conv = pxVar2;
      if (pxVar2 != (xmlBufPtr)0x0) {
        xmlCharEncOutput(output,1);
        return 0;
      }
      xmlCharEncCloseFunc(output->encoder);
      encoding = "creating encoding buffer";
      iVar3 = 2;
      msg = (char *)0x0;
    }
    __xmlSimpleError(7,iVar3,(xmlNodePtr)0x0,msg,encoding);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt, const char *encoding) {
    xmlOutputBufferPtr buf = ctxt->buf;

    if ((encoding != NULL) && (buf->encoder == NULL) && (buf->conv == NULL)) {
	buf->encoder = xmlFindCharEncodingHandler((const char *)encoding);
	if (buf->encoder == NULL) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL,
		       (const char *)encoding);
	    return(-1);
	}
	buf->conv = xmlBufCreate();
	if (buf->conv == NULL) {
	    xmlCharEncCloseFunc(buf->encoder);
	    xmlSaveErrMemory("creating encoding buffer");
	    return(-1);
	}
	/*
	 * initialize the state, e.g. if outputting a BOM
	 */
        xmlCharEncOutput(buf, 1);
    }
    return(0);
}